

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O3

void __thiscall pmx::PmxMorph::Read(PmxMorph *this,istream *stream,PmxSetting *setting)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PmxMorphUVOffset *pPVar4;
  PmxMorphBoneOffset *pPVar5;
  PmxMorphGroupOffset *pPVar6;
  PmxMorphVertexOffset *pPVar7;
  PmxMorphMaterialOffset *pPVar8;
  uint8_t in_CL;
  PmxMorphUVOffset *pPVar9;
  PmxMorphBoneOffset *pPVar10;
  PmxMorphGroupOffset *pPVar11;
  PmxMorphVertexOffset *pPVar12;
  PmxMorphMaterialOffset *pPVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->morph_english_name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::istream::read((char *)stream,(long)&this->category);
  std::istream::read((char *)stream,(long)&this->morph_type);
  piVar1 = &this->offset_count;
  std::istream::read((char *)stream,(long)piVar1);
  switch(this->morph_type) {
  case Group:
    iVar15 = *piVar1;
    lVar17 = (long)iVar15;
    uVar14 = 0xffffffffffffffff;
    if (-1 < lVar17) {
      uVar14 = lVar17 * 0x10;
    }
    pPVar6 = (PmxMorphGroupOffset *)operator_new__(uVar14);
    if (lVar17 != 0) {
      pPVar11 = pPVar6;
      do {
        (pPVar11->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010acd0;
        pPVar11->morph_index = 0;
        pPVar11->morph_weight = 0.0;
        pPVar11 = pPVar11 + 1;
      } while (pPVar11 != pPVar6 + lVar17);
    }
    pPVar11 = (this->group_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
    (this->group_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl = pPVar6;
    if (pPVar11 != (PmxMorphGroupOffset *)0x0) {
      operator_delete__(pPVar11);
      iVar15 = *piVar1;
    }
    if (0 < iVar15) {
      lVar17 = 0;
      lVar18 = 0;
      do {
        pPVar6 = (this->group_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)
                    ((long)&(pPVar6->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar17))
                  ((long)&(pPVar6->super_PmxMorphOffset)._vptr_PmxMorphOffset + lVar17,stream,
                   setting);
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar18 < this->offset_count);
    }
    break;
  case Vertex:
    iVar15 = *piVar1;
    uVar16 = (ulong)iVar15;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar16;
    uVar14 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
      uVar14 = SUB168(auVar3 * ZEXT816(0x18),0);
    }
    pPVar7 = (PmxMorphVertexOffset *)operator_new__(uVar14);
    if (uVar16 != 0) {
      pPVar12 = pPVar7;
      do {
        (pPVar12->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010ac10;
        pPVar12->vertex_index = 0;
        pPVar12->position_offset[0] = 0.0;
        pPVar12->position_offset[1] = 0.0;
        pPVar12->position_offset[2] = 0.0;
        pPVar12 = pPVar12 + 1;
      } while (pPVar12 != pPVar7 + uVar16);
    }
    pPVar12 = (this->vertex_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
    (this->vertex_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl = pPVar7;
    if (pPVar12 != (PmxMorphVertexOffset *)0x0) {
      operator_delete__(pPVar12);
      iVar15 = *piVar1;
    }
    if (0 < iVar15) {
      lVar17 = 0;
      lVar18 = 0;
      do {
        pPVar7 = (this->vertex_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar7->position_offset + lVar17 + -0xc))
                  ((long)pPVar7->position_offset + lVar17 + -0xc,stream,setting);
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x18;
      } while (lVar18 < this->offset_count);
    }
    break;
  case Bone:
    iVar15 = *piVar1;
    uVar16 = (ulong)iVar15;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar16;
    uVar14 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
      uVar14 = SUB168(auVar2 * ZEXT816(0x28),0);
    }
    pPVar5 = (PmxMorphBoneOffset *)operator_new__(uVar14);
    if (uVar16 != 0) {
      pPVar10 = pPVar5;
      do {
        (pPVar10->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010ac70;
        pPVar10->bone_index = 0;
        pPVar10->translation[0] = 0.0;
        pPVar10->translation[1] = 0.0;
        pPVar10->translation[2] = 0.0;
        pPVar10->rotation[0] = 0.0;
        pPVar10->rotation[1] = 0.0;
        pPVar10->rotation[2] = 0.0;
        pPVar10->rotation[3] = 0.0;
        pPVar10 = pPVar10 + 1;
      } while (pPVar10 != pPVar5 + uVar16);
    }
    pPVar10 = (this->bone_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
    (this->bone_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>.
    _M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl = pPVar5;
    if (pPVar10 != (PmxMorphBoneOffset *)0x0) {
      operator_delete__(pPVar10);
      iVar15 = *piVar1;
    }
    if (0 < iVar15) {
      lVar17 = 0;
      lVar18 = 0;
      do {
        pPVar5 = (this->bone_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar5->translation + lVar17 + -0xc))
                  ((long)pPVar5->translation + lVar17 + -0xc,stream,setting);
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x28;
      } while (lVar18 < this->offset_count);
    }
    break;
  case UV:
  case AdditionalUV1:
  case AdditionalUV2:
  case AdditionalUV3:
  case AdditionalUV4:
    iVar15 = *piVar1;
    lVar17 = (long)iVar15;
    uVar14 = 0xffffffffffffffff;
    if (-1 < lVar17) {
      uVar14 = lVar17 * 0x20;
    }
    pPVar4 = (PmxMorphUVOffset *)operator_new__(uVar14);
    if (lVar17 != 0) {
      pPVar9 = pPVar4;
      do {
        (pPVar9->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010ac40;
        pPVar9->vertex_index = 0;
        pPVar9->uv_offset[0] = 0.0;
        pPVar9->uv_offset[1] = 0.0;
        pPVar9->uv_offset[2] = 0.0;
        pPVar9->uv_offset[3] = 0.0;
        pPVar9 = pPVar9 + 1;
      } while (pPVar9 != pPVar4 + lVar17);
    }
    pPVar9 = (this->uv_offsets)._M_t.
             super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
             .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
    (this->uv_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>._M_t
    .super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>.
    super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl = pPVar4;
    if (pPVar9 != (PmxMorphUVOffset *)0x0) {
      operator_delete__(pPVar9);
      iVar15 = *piVar1;
    }
    if (0 < iVar15) {
      lVar17 = 0;
      lVar18 = 0;
      do {
        pPVar4 = (this->uv_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar4->uv_offset + lVar17 + -0xc))
                  ((long)pPVar4->uv_offset + lVar17 + -0xc,stream,setting);
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x20;
      } while (lVar18 < this->offset_count);
    }
    break;
  case Matrial:
    iVar15 = *piVar1;
    lVar17 = (long)iVar15;
    uVar14 = 0xffffffffffffffff;
    if (-1 < lVar17) {
      uVar14 = lVar17 * 0x80;
    }
    pPVar8 = (PmxMorphMaterialOffset *)operator_new__(uVar14);
    if (lVar17 != 0) {
      pPVar13 = pPVar8;
      do {
        (pPVar13->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_0010aca0;
        pPVar13->diffuse[0] = 0.0;
        pPVar13->diffuse[1] = 0.0;
        pPVar13->diffuse[2] = 0.0;
        pPVar13->diffuse[3] = 0.0;
        pPVar13->specular[0] = 0.0;
        pPVar13->specular[1] = 0.0;
        *(undefined8 *)(pPVar13->specular + 2) = 0;
        pPVar13->ambient[0] = 0.0;
        pPVar13->ambient[1] = 0.0;
        *(undefined8 *)(pPVar13->ambient + 2) = 0;
        pPVar13->edge_color[1] = 0.0;
        pPVar13->edge_color[2] = 0.0;
        *(undefined8 *)(pPVar13->edge_color + 3) = 0;
        pPVar13->texture_argb[0] = 0.0;
        pPVar13->texture_argb[1] = 0.0;
        pPVar13->texture_argb[2] = 0.0;
        pPVar13->texture_argb[3] = 0.0;
        pPVar13->sphere_texture_argb[0] = 0.0;
        pPVar13->sphere_texture_argb[1] = 0.0;
        pPVar13->sphere_texture_argb[2] = 0.0;
        pPVar13->sphere_texture_argb[3] = 0.0;
        pPVar13->toon_texture_argb[0] = 0.0;
        pPVar13->toon_texture_argb[1] = 0.0;
        pPVar13->toon_texture_argb[2] = 0.0;
        pPVar13->toon_texture_argb[3] = 0.0;
        pPVar13 = pPVar13 + 1;
      } while (pPVar13 != pPVar8 + lVar17);
    }
    pPVar13 = (this->material_offsets)._M_t.
              super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
              .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
    (this->material_offsets)._M_t.
    super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
    .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl = pPVar8;
    if (pPVar13 != (PmxMorphMaterialOffset *)0x0) {
      operator_delete__(pPVar13);
      iVar15 = *piVar1;
    }
    if (0 < iVar15) {
      lVar17 = 0;
      lVar18 = 0;
      do {
        pPVar8 = (this->material_offsets)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
                 .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
        (*(code *)**(undefined8 **)((long)pPVar8->diffuse + lVar17 + -0x10))
                  ((long)pPVar8->diffuse + lVar17 + -0x10,stream,setting);
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x80;
      } while (lVar18 < this->offset_count);
    }
    break;
  default:
    __cxa_rethrow();
  }
  return;
}

Assistant:

void PmxMorph::Read(std::istream *stream, PmxSetting *setting)
	{
		this->morph_name = ReadString(stream, setting->encoding);
		this->morph_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &category, sizeof(MorphCategory));
		stream->read((char*) &morph_type, sizeof(MorphType));
		stream->read((char*) &this->offset_count, sizeof(int));
		switch (this->morph_type)
		{
		case MorphType::Group:
			group_offsets = std::make_unique<PmxMorphGroupOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				group_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Vertex:
			vertex_offsets = std::make_unique<PmxMorphVertexOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				vertex_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Bone:
			bone_offsets = std::make_unique<PmxMorphBoneOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				bone_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::Matrial:
			material_offsets = std::make_unique<PmxMorphMaterialOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				material_offsets[i].Read(stream, setting);
			}
			break;
		case MorphType::UV:
		case MorphType::AdditionalUV1:
		case MorphType::AdditionalUV2:
		case MorphType::AdditionalUV3:
		case MorphType::AdditionalUV4:
			uv_offsets = std::make_unique<PmxMorphUVOffset []>(this->offset_count);
			for (int i = 0; i < offset_count; i++)
			{
				uv_offsets[i].Read(stream, setting);
			}
			break;
		default:
			throw;
		}
	}